

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O1

void predict_or_learn<false,true,false,false>(oaa *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  int iVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  v_array<char> vVar8;
  ulong uVar9;
  ostream *poVar10;
  uint uVar11;
  polyprediction *ppVar12;
  ulong uVar13;
  uint64_t uVar14;
  float fVar15;
  stringstream outputStringStream;
  undefined1 in_stack_fffffffffffffe08 [11];
  char in_stack_fffffffffffffe13;
  float fVar16;
  uint64_t in_stack_fffffffffffffe18;
  uint32_t uVar17;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  uVar11 = (ec->l).multi.label;
  uVar9 = (ulong)uVar11;
  fVar16 = (ec->l).simple.weight;
  if ((uVar9 == 0) || ((uVar11 != 0xffffffff && (o->k < uVar9)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not in {1,",0xe);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar14 = o->k;
  ppVar12 = o->pred;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    in_stack_fffffffffffffe18 = uVar14;
    if (uVar14 != 0) {
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar15 = (ec->pred).scalar;
        fVar2 = *(float *)((long)&ec->pred + 4);
        uVar5 = *(undefined4 *)((long)&ec->pred + 8);
        uVar6 = *(undefined4 *)((long)&ec->pred + 0xc);
        sVar7 = (ec->pred).scalars.erase_count;
        (ppVar12->scalars).end_array = (ec->pred).scalars.end_array;
        (ppVar12->scalars).erase_count = sVar7;
        ppVar12->scalar = fVar15;
        *(float *)((long)&(ppVar12->scalars)._begin + 4) = fVar2;
        *(undefined4 *)&(ppVar12->scalars)._end = uVar5;
        *(undefined4 *)((long)&(ppVar12->scalars)._end + 4) = uVar6;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
        ppVar12 = ppVar12 + 1;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 - (ulong)(uint)((int)in_stack_fffffffffffffe18 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar14,
               *(undefined8 *)(base + 0xe0),ppVar12,1);
  }
  fVar15 = 1.4013e-45;
  if (1 < o->k) {
    fVar15 = 1.4013e-45;
    uVar11 = 3;
    do {
      fVar2 = o->pred[uVar11 - 2].scalar;
      ppVar12 = o->pred + ((int)fVar15 - 1);
      if (ppVar12->scalar <= fVar2 && fVar2 != ppVar12->scalar) {
        fVar15 = (float)(uVar11 - 1);
      }
      uVar13 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar13 <= o->k);
  }
  if ((ec->passthrough != (features *)0x0) && (o->k != 0)) {
    uVar13 = 1;
    uVar11 = 2;
    do {
      if (ec->passthrough != (features *)0x0) {
        features::push_back(ec->passthrough,o->pred[uVar11 - 2].scalar,uVar13 ^ 0x398d9fda640553);
      }
      uVar13 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar13 <= o->k);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"1:",2);
  std::ostream::_M_insert<double>((double)o->pred->scalar);
  if (1 < o->k) {
    uVar11 = 3;
    do {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,&stack0xfffffffffffffe13,1);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      in_stack_fffffffffffffe13 = ':';
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,&stack0xfffffffffffffe13,1);
      std::ostream::_M_insert<double>((double)o->pred[uVar11 - 2].scalar);
      uVar13 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar13 <= o->k);
  }
  p_Var4 = o->all->print_text;
  iVar3 = o->all->raw_prediction;
  std::__cxx11::stringbuf::str();
  vVar8._end._3_1_ = in_stack_fffffffffffffe13;
  vVar8._0_11_ = in_stack_fffffffffffffe08;
  vVar8._end._4_4_ = fVar16;
  vVar8.end_array = (char *)in_stack_fffffffffffffe18;
  vVar8.erase_count = uVar9;
  (*p_Var4)(iVar3,(string)ec->tag,vVar8);
  uVar17 = (uint32_t)uVar9;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  (ec->pred).scalar = fVar15;
  (ec->l).multi.label = uVar17;
  (ec->l).simple.weight = fVar16;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}